

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strip_after_colon.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __const_iterator local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __const_iterator local_78;
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first;
  anon_class_1_0_00000001_for__M_pred isColon;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string str;
  
  str.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"Hello World",&local_31);
  std::allocator<char>::~allocator(&local_31);
  first.current._M_current._3_1_ = 0;
  std::rbegin<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::rend<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x10))
  ;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,main::__0>
            (local_58 + 8,local_58,local_70 + 0x10);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_30);
  std::operator<<(poVar2,"\n");
  std::rend<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  bVar1 = std::
          operator==<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_58 + 8),
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_80._M_current =
         (char *)std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::base((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_58 + 8));
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_78,&local_80);
    local_90._M_current =
         (char *)std::end<std::__cxx11::string>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_88,&local_90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               local_78,local_88);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_30);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_30);
  return str.field_2._12_4_;
}

Assistant:

int main() {
  string str = "Hello World";
  // Predicate
  auto isColon = [](int ch) { return ch == ':'; };
  // The last element satisfying the predicate or the first element if not found
  // Searching from the end backwards
  auto first = find_if(rbegin(str), rend(str), isColon);

  cout << str << "\n";

  // If found - delete everything after
  if (first != rend(str))
    str.erase(first.base(), end(str));

  cout << str << "\n";
}